

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_udev_p.cpp
# Opt level: O2

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  udev_device *dev;
  char *pcVar7;
  udev_device *dev_00;
  char *pcVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QByteArrayView QStack_78;
  QArrayDataPointer<char16_t> QStack_68;
  char *pcStack_50;
  QArrayDataPointer<char16_t> QStack_48;
  long lStack_30;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lStack_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(_o + 0x20) == 0) goto LAB_00137b43;
  QStack_48.d = (Data *)0x0;
  QStack_48.ptr = (char16_t *)0x0;
  QStack_48.size = 0;
  dev = (udev_device *)udev_monitor_receive_device();
  if (dev != (udev_device *)0x0) {
    pcVar7 = (char *)udev_device_get_action(dev);
    if (pcVar7 != (char *)0x0) {
      pcStack_50 = (char *)udev_device_get_devnode(dev);
      if (pcStack_50 != (char *)0x0) {
        QByteArrayView::QByteArrayView<const_char_*,_true>(&QStack_78,&pcStack_50);
        QVar9.m_data = (storage_type *)QStack_78.m_size;
        QVar9.m_size = (qsizetype)&QStack_68;
        QString::fromUtf8(QVar9);
        qVar3 = QStack_48.size;
        pcVar2 = QStack_48.ptr;
        pDVar1 = QStack_48.d;
        QStack_48.d = QStack_68.d;
        QStack_48.ptr = QStack_68.ptr;
        QStack_68.d = pDVar1;
        QStack_68.ptr = pcVar2;
        QStack_48.size = QStack_68.size;
        QStack_68.size = qVar3;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
        QVar10.m_data = (char *)0x10;
        QVar10.m_size = (qsizetype)&QStack_48;
        cVar4 = QString::startsWith(QVar10,0x13eb2b);
        if (cVar4 == '\0') {
          QVar11.m_data = (char *)0xd;
          QVar11.m_size = (qsizetype)&QStack_48;
          cVar4 = QString::startsWith(QVar11,0x13eb3c);
          if (cVar4 == '\0') goto LAB_00137b31;
          pcVar8 = "drm";
        }
        else {
          pcVar8 = "input";
        }
        bVar5 = checkDeviceType((QDeviceDiscoveryUDev *)_o,dev);
        if (bVar5) {
LAB_00137af1:
          iVar6 = qstrcmp(pcVar7,"add");
          if (iVar6 == 0) {
            QDeviceDiscovery::deviceDetected((QDeviceDiscovery *)_o,(QString *)&QStack_48);
          }
          iVar6 = qstrcmp(pcVar7,"remove");
          if (iVar6 == 0) {
            QDeviceDiscovery::deviceRemoved((QDeviceDiscovery *)_o,(QString *)&QStack_48);
          }
        }
        else {
          dev_00 = (udev_device *)udev_device_get_parent_with_subsystem_devtype(dev,pcVar8,0);
          if (dev_00 != (udev_device *)0x0) {
            bVar5 = checkDeviceType((QDeviceDiscoveryUDev *)_o,dev_00);
            if (bVar5) goto LAB_00137af1;
          }
        }
      }
    }
  }
LAB_00137b31:
  udev_device_unref(dev);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
LAB_00137b43:
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceDiscoveryUDev *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->handleUDevNotification(); break;
        default: ;
        }
    }
    (void)_a;
}